

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_astar_t *
ps_astar_start(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,int sf,int ef,int w1,int w2)

{
  float fVar1;
  long lVar2;
  listelem_alloc_t *plVar3;
  int local_54;
  int32 local_4c;
  ps_latpath_t *ppStack_48;
  int32 n_used;
  ps_latpath_t *path;
  ps_latnode_t *node;
  ps_astar_t *nbest;
  int local_28;
  int w2_local;
  int w1_local;
  int ef_local;
  int sf_local;
  float32 lwf_local;
  ngram_model_t *lmset_local;
  ps_lattice_t *dag_local;
  
  nbest._4_4_ = w2;
  local_28 = w1;
  w2_local = ef;
  w1_local = sf;
  ef_local = (int)lwf;
  _sf_local = lmset;
  lmset_local = (ngram_model_t *)dag;
  node = (ps_latnode_t *)
         __ckd_calloc__(1,0x60,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x6bb);
  *(ngram_model_t **)node = lmset_local;
  *(ngram_model_t **)&node->basewid = _sf_local;
  node->lef = ef_local;
  node->sf = w1_local;
  if (w2_local < 0) {
    *(int *)&node->reachable = *(int *)&lmset_local->wid + 1;
  }
  else {
    *(int *)&node->reachable = w2_local;
  }
  node->node_id = local_28;
  (node->info).fanin = nbest._4_4_;
  plVar3 = listelem_alloc_init(0x20);
  *(listelem_alloc_t **)&node[1].lef = plVar3;
  for (path = *(ps_latpath_t **)&lmset_local->lw; path != (ps_latpath_t *)0x0;
      path = (ps_latpath_t *)path[2].node) {
    if (path == (ps_latpath_t *)lmset_local->word_str) {
      *(undefined4 *)&path[1].node = 0;
    }
    else if (path[1].parent == (ps_latpath_s *)0x0) {
      *(undefined4 *)&path[1].node = 0xe0000000;
    }
    else {
      *(undefined4 *)&path[1].node = 1;
    }
  }
  node->next = (ps_latnode_s *)0x0;
  node->alt = (ps_latnode_s *)0x0;
  for (path = *(ps_latpath_t **)&lmset_local->lw; path != (ps_latpath_t *)0x0;
      path = (ps_latpath_t *)path[2].node) {
    if (*(int *)((long)&path->next + 4) == w1_local) {
      best_rem_score((ps_astar_t *)node,(ps_latnode_t *)path);
      ppStack_48 = (ps_latpath_t *)
                   __listelem_malloc__(*(listelem_alloc_t **)&node[1].lef,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                       ,0x6da);
      ppStack_48->node = (ps_latnode_t *)path;
      ppStack_48->parent = (ps_latpath_s *)0x0;
      lVar2._0_4_ = node->basewid;
      lVar2._4_4_ = node->fef;
      if (lVar2 == 0) {
        ppStack_48->score = 0;
      }
      else {
        fVar1 = (float)node->lef;
        if (local_28 < 0) {
          local_54 = ngram_bg_score(*(ngram_model_t **)&node->basewid,*(int32 *)&path->parent,
                                    nbest._4_4_,&local_4c);
        }
        else {
          local_54 = ngram_tg_score(*(ngram_model_t **)&node->basewid,*(int32 *)&path->parent,
                                    nbest._4_4_,local_28,&local_4c);
        }
        ppStack_48->score = (int)(fVar1 * (float)local_54);
      }
      ppStack_48->score = ppStack_48->score >> 10;
      path_insert((ps_astar_t *)node,ppStack_48,ppStack_48->score + *(int *)&path[1].node);
    }
  }
  return (ps_astar_t *)node;
}

Assistant:

ps_astar_t *
ps_astar_start(ps_lattice_t *dag,
                  ngram_model_t *lmset,
                  float32 lwf,
                  int sf, int ef,
                  int w1, int w2)
{
    ps_astar_t *nbest;
    ps_latnode_t *node;

    nbest = ckd_calloc(1, sizeof(*nbest));
    nbest->dag = dag;
    nbest->lmset = lmset;
    nbest->lwf = lwf;
    nbest->sf = sf;
    if (ef < 0)
        nbest->ef = dag->n_frames + 1;
    else
        nbest->ef = ef;
    nbest->w1 = w1;
    nbest->w2 = w2;
    nbest->latpath_alloc = listelem_alloc_init(sizeof(ps_latpath_t));

    /* Initialize rem_score (A* heuristic) to default values */
    for (node = dag->nodes; node; node = node->next) {
        if (node == dag->end)
            node->info.rem_score = 0;
        else if (node->exits == NULL)
            node->info.rem_score = WORST_SCORE;
        else
            node->info.rem_score = 1;   /* +ve => unknown value */
    }

    /* Create initial partial hypotheses list consisting of nodes starting at sf */
    nbest->path_list = nbest->path_tail = NULL;
    for (node = dag->nodes; node; node = node->next) {
        if (node->sf == sf) {
            ps_latpath_t *path;
            int32 n_used;

            best_rem_score(nbest, node);
            path = listelem_malloc(nbest->latpath_alloc);
            path->node = node;
            path->parent = NULL;
            if (nbest->lmset)
                path->score = nbest->lwf *
                    ((w1 < 0)
                    ? ngram_bg_score(nbest->lmset, node->basewid, w2, &n_used)
                    : ngram_tg_score(nbest->lmset, node->basewid, w2, w1, &n_used));
            else
                path->score = 0;
            path->score >>= SENSCR_SHIFT;
            path_insert(nbest, path, path->score + node->info.rem_score);
        }
    }

    return nbest;
}